

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteActionResultType(BinaryWriterSpec *this,Action *action)

{
  string_view name;
  string_view name_00;
  Module *this_00;
  Export *pEVar1;
  Func *pFVar2;
  ulong uVar3;
  Global *pGVar4;
  ulong uVar5;
  
  this_00 = Script::GetModule(this->script_,&action->module_var);
  Stream::Writef(this->json_stream_,"[");
  if (action->type_ == Get) {
    name_00.data_ = (action->name)._M_dataplus._M_p;
    name_00.size_ = (action->name)._M_string_length;
    pEVar1 = Module::GetExport(this_00,name_00);
    if (pEVar1->kind != Global) {
      __assert_fail("export_->kind == ExternalKind::Global",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc"
                    ,0x176,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteActionResultType(const Action &)"
                   );
    }
    pGVar4 = Module::GetGlobal(this_00,&pEVar1->var);
    WriteTypeObject(this,(Type)(pGVar4->type).enum_);
  }
  else if (action->type_ == Invoke) {
    name.data_ = (action->name)._M_dataplus._M_p;
    name.size_ = (action->name)._M_string_length;
    pEVar1 = Module::GetExport(this_00,name);
    if (pEVar1->kind != First) {
      __assert_fail("export_->kind == ExternalKind::Func",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer-spec.cc"
                    ,0x16c,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteActionResultType(const Action &)"
                   );
    }
    pFVar2 = Module::GetFunc(this_00,&pEVar1->var);
    uVar3 = (ulong)((long)(pFVar2->decl).sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pFVar2->decl).sig.result_types.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    if ((int)uVar3 != 0) {
      uVar5 = 0;
      do {
        WriteTypeObject(this,(Type)(pFVar2->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar5].enum_);
        uVar5 = uVar5 + 1;
      } while ((uVar3 & 0xffffffff) != uVar5);
    }
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteActionResultType(const Action& action) {
  const Module* module = script_->GetModule(action.module_var);
  const Export* export_;
  json_stream_->Writef("[");
  switch (action.type()) {
    case ActionType::Invoke: {
      export_ = module->GetExport(action.name);
      assert(export_->kind == ExternalKind::Func);
      const Func* func = module->GetFunc(export_->var);
      Index num_results = func->GetNumResults();
      for (Index i = 0; i < num_results; ++i)
        WriteTypeObject(func->GetResultType(i));
      break;
    }

    case ActionType::Get: {
      export_ = module->GetExport(action.name);
      assert(export_->kind == ExternalKind::Global);
      const Global* global = module->GetGlobal(export_->var);
      WriteTypeObject(global->type);
      break;
    }
  }
  json_stream_->Writef("]");
}